

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_discovery_peer.cpp
# Opt level: O1

void __thiscall
udpdiscovery::impl::PeerEnv::processReceivedBuffer
          (PeerEnv *this,long cur_time_ms,IpPort *from,string *buffer)

{
  list<udpdiscovery::DiscoveredPeer,_std::allocator<udpdiscovery::DiscoveredPeer>_> *this_00;
  size_t *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  SamePeerMode SVar4;
  ProtocolVersion PVar5;
  _List_node_base *p_Var6;
  _Node *p_Var7;
  iterator __position;
  uint uVar8;
  bool bVar9;
  Packet packet;
  Packet local_a0;
  value_type local_68;
  
  paVar2 = &local_a0.user_data_.field_2;
  local_a0.user_data_._M_string_length = 0;
  local_a0.user_data_.field_2._M_local_buf[0] = '\0';
  local_a0.user_data_._M_dataplus._M_p = (pointer)paVar2;
  PVar5 = Packet::Parse(&local_a0,buffer);
  if ((((PVar5 != kProtocolVersionUnknown) &&
       ((int)(this->parameters_).min_supported_protocol_version_ <= (int)PVar5)) &&
      ((int)PVar5 <= (int)(this->parameters_).max_supported_protocol_version_)) &&
     (((this->parameters_).application_id_ == local_a0.application_id_ &&
      (((this->parameters_).discover_self_ != false || (local_a0.peer_id_ != this->peer_id_)))))) {
    pthread_mutex_lock((pthread_mutex_t *)&this->lock_);
    this_00 = &this->discovered_peers_;
    p_Var6 = (this->discovered_peers_).
             super__List_base<udpdiscovery::DiscoveredPeer,_std::allocator<udpdiscovery::DiscoveredPeer>_>
             ._M_impl._M_node.super__List_node_base._M_next;
    __position._M_node = (_List_node_base *)this_00;
    if (p_Var6 != (_List_node_base *)this_00) {
      SVar4 = (this->parameters_).same_peer_mode_;
      do {
        uVar8 = (uint)p_Var6[1]._M_next;
        if (SVar4 == kSamePeerIpAndPort) {
          if (from->ip_ == uVar8) {
            bVar9 = from->port_ == (int)((ulong)p_Var6[1]._M_next >> 0x20);
            goto LAB_00105afa;
          }
        }
        else if (SVar4 == kSamePeerIp) {
          bVar9 = from->ip_ == uVar8;
LAB_00105afa:
          __position._M_node = p_Var6;
          if (bVar9) break;
        }
        p_Var6 = p_Var6->_M_next;
        __position._M_node = (_List_node_base *)this_00;
      } while (p_Var6 != (_List_node_base *)this_00);
    }
    if (local_a0.packet_type_ == '\x01') {
      if (__position._M_node != (_List_node_base *)this_00) {
        std::__cxx11::
        list<udpdiscovery::DiscoveredPeer,_std::allocator<udpdiscovery::DiscoveredPeer>_>::_M_erase
                  (this_00,__position);
      }
    }
    else if (local_a0.packet_type_ == '\0') {
      if (__position._M_node == (_List_node_base *)this_00) {
        paVar3 = &local_68.user_data_.field_2;
        local_68.ip_port_.ip_ = 0;
        local_68.ip_port_.port_ = 0;
        local_68.user_data_.field_2._8_8_ = 0;
        local_68.last_received_packet_ = 0;
        local_68.last_updated_ = 0;
        local_68.user_data_._M_string_length = 0;
        local_68.user_data_.field_2._M_allocated_capacity = 0;
        local_68.user_data_._M_dataplus._M_p = (pointer)paVar3;
        p_Var7 = std::__cxx11::
                 list<udpdiscovery::DiscoveredPeer,_std::allocator<udpdiscovery::DiscoveredPeer>_>::
                 _M_create_node(this_00,&local_68);
        std::__detail::_List_node_base::_M_hook(&p_Var7->super__List_node_base);
        psVar1 = &(this->discovered_peers_).
                  super__List_base<udpdiscovery::DiscoveredPeer,_std::allocator<udpdiscovery::DiscoveredPeer>_>
                  ._M_impl._M_node._M_size;
        *psVar1 = *psVar1 + 1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68.user_data_._M_dataplus._M_p != paVar3) {
          operator_delete(local_68.user_data_._M_dataplus._M_p);
        }
        (this->discovered_peers_).
        super__List_base<udpdiscovery::DiscoveredPeer,_std::allocator<udpdiscovery::DiscoveredPeer>_>
        ._M_impl._M_node.super__List_node_base._M_prev[1]._M_next = (_List_node_base *)*from;
        p_Var6 = (this->discovered_peers_).
                 super__List_base<udpdiscovery::DiscoveredPeer,_std::allocator<udpdiscovery::DiscoveredPeer>_>
                 ._M_impl._M_node.super__List_node_base._M_prev;
        std::__cxx11::string::_M_assign((string *)&p_Var6[1]._M_prev);
        p_Var6[3]._M_prev = (_List_node_base *)local_a0.snapshot_index_;
        __position._M_node =
             (this->discovered_peers_).
             super__List_base<udpdiscovery::DiscoveredPeer,_std::allocator<udpdiscovery::DiscoveredPeer>_>
             ._M_impl._M_node.super__List_node_base._M_prev;
      }
      else if (__position._M_node[3]._M_prev < local_a0.snapshot_index_) {
        std::__cxx11::string::_M_assign((string *)&__position._M_node[1]._M_prev);
        __position._M_node[3]._M_prev = (_List_node_base *)local_a0.snapshot_index_;
      }
      __position._M_node[4]._M_next = (_List_node_base *)cur_time_ms;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->lock_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.user_data_._M_dataplus._M_p != paVar2) {
    operator_delete(local_a0.user_data_._M_dataplus._M_p);
  }
  return;
}

Assistant:

void processReceivedBuffer(long cur_time_ms, const IpPort& from,
                             const std::string& buffer) {
    Packet packet;

    ProtocolVersion packet_version = packet.Parse(buffer);
    bool is_supported_packet_version =
        (packet_version >= parameters_.min_supported_protocol_version() &&
         packet_version <= parameters_.max_supported_protocol_version());

    if (packet_version != kProtocolVersionUnknown &&
        is_supported_packet_version) {
      bool accept_packet = false;
      if (parameters_.application_id() == packet.application_id()) {
        if (!parameters_.discover_self()) {
          if (packet.peer_id() != peer_id_) {
            accept_packet = true;
          }
        } else {
          accept_packet = true;
        }
      }

      if (accept_packet) {
        lock_.Lock();

        std::list<DiscoveredPeer>::iterator find_it = discovered_peers_.end();
        for (std::list<DiscoveredPeer>::iterator it = discovered_peers_.begin();
             it != discovered_peers_.end(); ++it) {
          if (Same(parameters_.same_peer_mode(), (*it).ip_port(), from)) {
            find_it = it;
            break;
          }
        }

        if (packet.packet_type() == kPacketIAmHere) {
          if (find_it == discovered_peers_.end()) {
            discovered_peers_.push_back(DiscoveredPeer());
            discovered_peers_.back().set_ip_port(from);
            discovered_peers_.back().SetUserData(packet.user_data(),
                                                 packet.snapshot_index());
            discovered_peers_.back().set_last_updated(cur_time_ms);
          } else {
            bool update_user_data =
                ((*find_it).last_received_packet() < packet.snapshot_index());
            if (update_user_data) {
              (*find_it).SetUserData(packet.user_data(),
                                     packet.snapshot_index());
            }
            (*find_it).set_last_updated(cur_time_ms);
          }
        } else if (packet.packet_type() == kPacketIAmOutOfHere) {
          if (find_it != discovered_peers_.end()) {
            discovered_peers_.erase(find_it);
          }
        }

        lock_.Unlock();
      }
    }
  }